

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_StageERKNoFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is)

{
  uint in_EDX;
  realtype *in_RSI;
  long in_RDI;
  int nvec;
  int j;
  int retval;
  int iVar1;
  int iVar2;
  int local_4;
  
  local_4 = mriStep_RKCoeffs((MRIStepCoupling)in_RSI[7],in_EDX,(int *)in_RSI[10],
                             (realtype *)in_RSI[0xc],(realtype *)in_RSI[0xd]);
  if (local_4 == 0) {
    *(undefined8 *)in_RSI[0x33] = 0x3ff0000000000000;
    *(undefined8 *)in_RSI[0x34] = *(undefined8 *)(in_RDI + 0x108);
    iVar1 = 1;
    for (iVar2 = 0; iVar2 < (int)in_EDX; iVar2 = iVar2 + 1) {
      if ((*(int *)(in_RSI + 3) != 0) && (-1 < *(int *)((long)in_RSI[10] + (long)iVar2 * 4))) {
        *(double *)((long)in_RSI[0x33] + (long)iVar1 * 8) =
             *(double *)(in_RDI + 0x168) *
             *(double *)((long)in_RSI[0xc] + (long)*(int *)((long)in_RSI[10] + (long)iVar2 * 4) * 8)
        ;
        *(undefined8 *)((long)in_RSI[0x34] + (long)iVar1 * 8) =
             *(undefined8 *)
              ((long)in_RSI[5] + (long)*(int *)((long)in_RSI[10] + (long)iVar2 * 4) * 8);
        iVar1 = iVar1 + 1;
      }
      if ((*(int *)((long)in_RSI + 0x1c) != 0) &&
         (-1 < *(int *)((long)in_RSI[10] + (long)iVar2 * 4))) {
        *(double *)((long)in_RSI[0x33] + (long)iVar1 * 8) =
             *(double *)(in_RDI + 0x168) *
             *(double *)((long)in_RSI[0xd] + (long)*(int *)((long)in_RSI[10] + (long)iVar2 * 4) * 8)
        ;
        *(undefined8 *)((long)in_RSI[0x34] + (long)iVar1 * 8) =
             *(undefined8 *)
              ((long)in_RSI[6] + (long)*(int *)((long)in_RSI[10] + (long)iVar2 * 4) * 8);
        iVar1 = iVar1 + 1;
      }
    }
    iVar1 = N_VLinearCombination
                      ((int)((ulong)in_RDI >> 0x20),in_RSI,(N_Vector *)((ulong)in_EDX << 0x20),
                       (N_Vector)CONCAT44(iVar2,iVar1));
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int mriStep_StageERKNoFast(ARKodeMem ark_mem,
                           ARKodeMRIStepMem step_mem, int is)
{
  int retval, j, nvec;

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep ERK stage\n");
#endif

  /* determine effective ERK coefficients (store in cvals) */
  retval = mriStep_RKCoeffs(step_mem->MRIC, is, step_mem->stage_map,
                            step_mem->Ae_row, step_mem->Ai_row);
  if (retval != ARK_SUCCESS) { return(retval); }

  /* call fused vector operation to perform ERK update */
  step_mem->cvals[0] = ONE;
  step_mem->Xvecs[0] = ark_mem->ycur;
  nvec = 1;
  for (j = 0; j < is; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      step_mem->cvals[nvec] = ark_mem->h *
        step_mem->Ae_row[step_mem->stage_map[j]];
      step_mem->Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      step_mem->cvals[nvec] = ark_mem->h *
        step_mem->Ai_row[step_mem->stage_map[j]];
      step_mem->Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }
  /* Is there a case where we have an explicit update with Fsi? */

  retval = N_VLinearCombination(nvec, step_mem->cvals,
                                step_mem->Xvecs, ark_mem->ycur);
  if (retval != 0) return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}